

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O0

bool SetHasKeys<std::__cxx11::string,char[21],char[9],char[7],char[11],char[7],char[7],char[11],char[11]>
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *set,char (*key) [21],char (*args) [9],char (*args_1) [7],char (*args_2) [11],
               char (*args_3) [7],char (*args_4) [7],char (*args_5) [11],char (*args_6) [11])

{
  size_type sVar1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RCX;
  char (*in_R8) [9];
  char (*in_R9) [7];
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000010;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  key_type *in_stack_ffffffffffffff50;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff58;
  bool local_91;
  allocator<char> *__a;
  char (*in_stack_ffffffffffffff90) [7];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  allocator<char> local_29 [25];
  char (*in_stack_fffffffffffffff0) [11];
  char (*args_5_00) [11];
  
  args_5_00 = *(char (**) [11])(in_FS_OFFSET + 0x28);
  __a = local_29;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff98,*in_stack_ffffffffffffff90,__a);
  sVar1 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  local_91 = true;
  if (sVar1 == 0) {
    local_91 = SetHasKeys<std::__cxx11::string,char[9],char[7],char[11],char[7],char[7],char[11],char[11]>
                         (in_RCX,in_R8,in_R9,(char (*) [11])in_stack_ffffffffffffff98,
                          in_stack_ffffffffffffff90,(char (*) [7])__a,in_stack_fffffffffffffff0,
                          args_5_00);
    in_stack_ffffffffffffff48 = in_stack_00000010;
  }
  std::__cxx11::string::~string(in_stack_ffffffffffffff48);
  std::allocator<char>::~allocator(local_29);
  if (*(char (**) [11])(in_FS_OFFSET + 0x28) == args_5_00) {
    return local_91;
  }
  __stack_chk_fail();
}

Assistant:

static inline bool SetHasKeys(const std::set<T>& set, const Tk& key, const Args&... args)
{
    return (set.count(key) != 0) || SetHasKeys(set, args...);
}